

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O3

bool embree::operator<(Token *a,Token *b)

{
  Type TVar1;
  Type TVar2;
  byte extraout_var;
  byte extraout_var_00;
  byte extraout_var_01;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  
  TVar2 = a->ty;
  TVar1 = b->ty;
  bVar5 = SBORROW4(TVar2,TVar1);
  bVar4 = (int)(TVar2 - TVar1) < 0;
  if (TVar2 != TVar1) goto LAB_00195834;
  switch(TVar2) {
  case TY_CHAR:
    bVar5 = SBORROW1((a->field_1).c,(b->field_1).c);
    bVar4 = (char)((a->field_1).c - (b->field_1).c) < '\0';
    goto LAB_00195834;
  case TY_INT:
    bVar5 = SBORROW4((a->field_1).i,(b->field_1).i);
    bVar4 = (a->field_1).i - (b->field_1).i < 0;
LAB_00195834:
    return bVar5 != bVar4;
  case TY_FLOAT:
    return (a->field_1).f <= (b->field_1).f && (b->field_1).f != (a->field_1).f;
  case TY_IDENTIFIER:
    std::__cxx11::string::compare((string *)&a->str);
    bVar3 = extraout_var_00;
    break;
  case TY_STRING:
    std::__cxx11::string::compare((string *)&a->str);
    bVar3 = extraout_var;
    break;
  case TY_SYMBOL:
    std::__cxx11::string::compare((string *)&a->str);
    bVar3 = extraout_var_01;
    break;
  default:
    return false;
  }
  return (bool)(bVar3 >> 7);
}

Assistant:

bool operator <( const Token& a, const Token& b ) {
      if (a.ty != b.ty) return (int)a.ty < (int)b.ty;
      if (a.ty == TY_CHAR) return a.c < b.c;
      if (a.ty == TY_INT) return a.i < b.i;
      if (a.ty == TY_FLOAT) return a.f < b.f;
      if (a.ty == TY_IDENTIFIER) return a.str < b.str;
      if (a.ty == TY_STRING) return a.str < b.str;
      if (a.ty == TY_SYMBOL) return a.str < b.str;
      return false;
    }